

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestCheckMacros.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_5efc::TestCheckArrayCloseFailureContainsCorrectDetails::RunImpl
          (TestCheckArrayCloseFailureContainsCorrectDetails *this)

{
  TestResults *pTVar1;
  TestResults **ppTVar2;
  TestDetails **ppTVar3;
  int line;
  TestDetails testDetails;
  ScopedCurrentTest scopedResults;
  int data2 [4];
  int data1 [4];
  TestResults testResults;
  RecordingReporter reporter;
  int local_8d4;
  TestDetails local_8d0;
  float local_8ac;
  ScopedCurrentTest local_8a8;
  int local_898 [10];
  TestDetails local_870;
  TestResults local_850;
  TestReporter local_838;
  undefined4 local_830;
  undefined1 local_82c;
  undefined1 local_72c;
  undefined4 local_62c;
  char local_628 [256];
  int local_528;
  char local_524 [256];
  char local_424 [256];
  undefined1 local_324;
  undefined4 local_224;
  undefined1 local_220;
  undefined1 local_120;
  undefined8 local_20;
  undefined8 uStack_18;
  undefined4 local_10;
  
  local_8d4 = 0;
  local_838._vptr_TestReporter = (_func_int **)&PTR__TestReporter_00150810;
  local_830 = 0;
  local_62c = 0;
  local_528 = 0;
  local_224 = 0;
  local_82c = 0;
  local_72c = 0;
  local_628[0] = '\0';
  local_524[0] = '\0';
  local_424[0] = '\0';
  local_324 = 0;
  local_220 = 0;
  local_120 = 0;
  local_20 = 0;
  uStack_18 = 0;
  local_10 = 0;
  UnitTest::TestResults::TestResults(&local_850,&local_838);
  UnitTest::TestDetails::TestDetails(&local_8d0,"arrayCloseTest","arrayCloseSuite","filename",-1);
  ScopedCurrentTest::ScopedCurrentTest(&local_8a8,&local_850,&local_8d0);
  local_898[4] = 0;
  local_898[5] = 1;
  local_898[6] = 2;
  local_898[7] = 3;
  local_898[0] = 0;
  local_898[1] = 1;
  local_898[2] = 3;
  local_898[3] = 3;
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_8ac = 0.01;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_870,*ppTVar3,400);
  UnitTest::CheckArrayClose<int[4],int[4],float>
            (pTVar1,(int (*) [4])(local_898 + 4),(int (*) [4])local_898,4,&local_8ac,&local_870);
  local_8d4 = 400;
  ScopedCurrentTest::~ScopedCurrentTest(&local_8a8);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_8d0,*ppTVar3,0x193);
  UnitTest::CheckEqual(pTVar1,"arrayCloseTest",local_424,&local_8d0);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_8d0,*ppTVar3,0x194);
  UnitTest::CheckEqual(pTVar1,"arrayCloseSuite",local_524,&local_8d0);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_8d0,*ppTVar3,0x195);
  UnitTest::CheckEqual(pTVar1,"filename",local_628,&local_8d0);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  ppTVar3 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_8d0,*ppTVar3,0x196);
  UnitTest::CheckEqual<int,int>(pTVar1,&local_8d4,&local_528,&local_8d0);
  UnitTest::TestReporter::~TestReporter(&local_838);
  return;
}

Assistant:

TEST(CheckArrayCloseFailureContainsCorrectDetails)
{
    int line = 0;
    RecordingReporter reporter;
    {
        UnitTest::TestResults testResults(&reporter);
		UnitTest::TestDetails testDetails("arrayCloseTest", "arrayCloseSuite", "filename", -1);
		ScopedCurrentTest scopedResults(testResults, &testDetails);

		int const data1[4] = { 0, 1, 2, 3 };
        int const data2[4] = { 0, 1, 3, 3 };
        CHECK_ARRAY_CLOSE (data1, data2, 4, 0.01f);     line = __LINE__;
    }

    CHECK_EQUAL("arrayCloseTest", reporter.lastFailedTest);
    CHECK_EQUAL("arrayCloseSuite", reporter.lastFailedSuite);
    CHECK_EQUAL("filename", reporter.lastFailedFile);
    CHECK_EQUAL(line, reporter.lastFailedLine);
}